

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O0

REF_STATUS ref_facelift_complexity(REF_DBL *metric,REF_GRID ref_grid,REF_DBL *complexity)

{
  REF_NODE ref_node_00;
  REF_CELL ref_cell_00;
  REF_STATUS RVar1;
  uint uVar2;
  double dVar3;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL n [3];
  REF_DBL local_128;
  REF_DBL s [3];
  REF_DBL local_108;
  REF_DBL r [3];
  REF_DBL local_e8;
  REF_DBL m2 [3];
  double local_c8;
  REF_DBL det;
  REF_DBL area;
  REF_INT nodes [27];
  int local_40;
  int local_3c;
  REF_INT cell;
  REF_INT cell_node;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_DBL *complexity_local;
  REF_GRID ref_grid_local;
  REF_DBL *metric_local;
  
  ref_node_00 = ref_grid->node;
  ref_cell_00 = ref_grid->cell[3];
  *complexity = 0.0;
  local_40 = 0;
  do {
    if (ref_cell_00->max <= local_40) {
      metric_local._4_4_ = ref_mpi_allsum(ref_grid->mpi,complexity,1,3);
      if (metric_local._4_4_ == 0) {
        metric_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x545,"ref_facelift_complexity",(ulong)metric_local._4_4_,"dbl sum");
      }
      return metric_local._4_4_;
    }
    RVar1 = ref_cell_nodes(ref_cell_00,local_40,(REF_INT *)&area);
    if (RVar1 == 0) {
      uVar2 = ref_node_tri_area(ref_node_00,(REF_INT *)&area,&det);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x536,"ref_facelift_complexity",(ulong)uVar2,"area");
        return uVar2;
      }
      for (local_3c = 0; local_3c < ref_cell_00->node_per; local_3c = local_3c + 1) {
        if (ref_node_00->ref_mpi->id == ref_node_00->part[nodes[(long)local_3c + -2]]) {
          uVar2 = ref_recon_rsn(ref_grid,nodes[(long)local_3c + -2],&local_108,&local_128,
                                (REF_DBL *)&ref_private_macro_code_rss_1);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0x539,"ref_facelift_complexity",(ulong)uVar2,"rsn");
            return uVar2;
          }
          uVar2 = ref_matrix_extract2(metric + nodes[(long)local_3c + -2] * 6,&local_108,&local_128,
                                      &local_e8);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0x53b,"ref_facelift_complexity",(ulong)uVar2,"extract");
            return uVar2;
          }
          uVar2 = ref_matrix_det_m2(&local_e8,&local_c8);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0x53c,"ref_facelift_complexity",(ulong)uVar2,"2x2 det");
            return uVar2;
          }
          if (0.0 < local_c8) {
            dVar3 = sqrt(local_c8);
            *complexity = (dVar3 * det) / (double)ref_cell_00->node_per + *complexity;
          }
        }
      }
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_facelift_complexity(REF_DBL *metric,
                                                  REF_GRID ref_grid,
                                                  REF_DBL *complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell_node, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL area, det, m2[3], r[3], s[3], n[3];
  ref_cell = ref_grid_tri(ref_grid);
  *complexity = 0.0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_node_tri_area(ref_node, nodes, &area), "area");
    for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell); cell_node++) {
      if (ref_node_owned(ref_node, nodes[cell_node])) {
        RSS(ref_recon_rsn(ref_grid, nodes[cell_node], r, s, n), "rsn");
        RSS(ref_matrix_extract2(&(metric[6 * nodes[cell_node]]), r, s, m2),
            "extract");
        RSS(ref_matrix_det_m2(m2, &det), "2x2 det");
        if (det > 0.0) {
          (*complexity) +=
              sqrt(det) * area / ((REF_DBL)ref_cell_node_per(ref_cell));
        }
      }
    }
  }
  RSS(ref_mpi_allsum(ref_grid_mpi(ref_grid), complexity, 1, REF_DBL_TYPE),
      "dbl sum");

  return REF_SUCCESS;
}